

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

void Wlc_NtkFindOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  long lVar1;
  word *pEntry;
  uint uVar2;
  int iVar3;
  word wVar4;
  int iVar5;
  int w;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  byte bVar15;
  uint local_70;
  
  uVar6 = (int)((long)pWlcObj - (long)p->pObjs >> 3) * -0x55555555;
  if ((-1 < (int)uVar6) && ((int)uVar6 < (p->vCopies).nSize)) {
    uVar2 = vTtMem->nEntrySize;
    iVar12 = pWlcObj->Beg - pWlcObj->End;
    iVar5 = -iVar12;
    if (0 < iVar12) {
      iVar5 = iVar12;
    }
    iVar12 = (p->vCopies).pArray[uVar6 & 0x7fffffff];
    uVar13 = 0;
    while ((-1 < iVar12 && (lVar1 = (long)iVar12 + uVar13, lVar1 < (p->vBits).nSize))) {
      uVar6 = (p->vBits).pArray[lVar1];
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar7 = (uVar6 >> 1) * pGia->nSimWords;
      if (((int)uVar7 < 0) || (pGia->vSims->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pEntry = pGia->vSims->pArray + uVar7;
      wVar4 = *pEntry;
      bVar15 = 0 < (int)uVar2 & (byte)wVar4;
      if (bVar15 == 1) {
        uVar9 = 0;
        do {
          pEntry[uVar9] = ~pEntry[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      piVar10 = Vec_MemHashLookup(vTtMem,pEntry);
      iVar3 = *piVar10;
      if (0 < iVar3) {
        uVar7 = (int)((ulong)((long)pWlcObj - (long)p->pObjs) >> 3) * -0x55555555;
        iVar8 = pWlcObj->End - pWlcObj->Beg;
        iVar14 = -iVar8;
        if (0 < iVar8) {
          iVar14 = iVar8;
        }
        local_70 = (uint)wVar4;
        pcVar11 = Wlc_ObjName(p,uVar7);
        printf("Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n",(ulong)uVar7,
               (ulong)(iVar14 + 1),uVar13 & 0xffffffff,iVar3,(ulong)((uVar6 ^ local_70) & 1),pcVar11
              );
      }
      if (bVar15 != 0) {
        uVar9 = 0;
        do {
          pEntry[uVar9] = ~pEntry[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      uVar13 = uVar13 + 1;
      if (uVar13 == iVar5 + 1) {
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wlc_NtkFindOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry > 0 )
            printf( "Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n", Wlc_ObjId(p, pWlcObj), Wlc_ObjRange(pWlcObj), k, Entry, fCompl ^ Abc_LitIsCompl(iLit), Wlc_ObjName(p, Wlc_ObjId(p, pWlcObj)) );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        //printf( "%2d ", Entry );
        //Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        //printf( "\n" );
    }
    //printf( "\n" );
}